

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random.c
# Opt level: O0

uint32_t chacha_next32(mi_random_ctx_t *ctx)

{
  uint32_t uVar1;
  long in_RDI;
  uint32_t x;
  mi_random_ctx_t *in_stack_00000040;
  
  if (*(int *)(in_RDI + 0x80) < 1) {
    chacha_block(in_stack_00000040);
    *(undefined4 *)(in_RDI + 0x80) = 0x10;
  }
  uVar1 = *(uint32_t *)(in_RDI + 0x40 + (long)(0x10 - *(int *)(in_RDI + 0x80)) * 4);
  *(undefined4 *)(in_RDI + 0x40 + (long)(0x10 - *(int *)(in_RDI + 0x80)) * 4) = 0;
  *(int *)(in_RDI + 0x80) = *(int *)(in_RDI + 0x80) + -1;
  return uVar1;
}

Assistant:

static uint32_t chacha_next32(mi_random_ctx_t* ctx) {
  if (ctx->output_available <= 0) {
    chacha_block(ctx);
    ctx->output_available = 16; // (assign again to suppress static analysis warning)
  }
  const uint32_t x = ctx->output[16 - ctx->output_available];
  ctx->output[16 - ctx->output_available] = 0; // reset once the data is handed out
  ctx->output_available--;
  return x;
}